

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>::
print<std::back_insert_iterator<std::__cxx11::string>>
          (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  ListRecord *pLVar1;
  LegendreCoefficients *entry;
  ListRecord *this_00;
  
  record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
            ((InterpolationBase *)this,it,MAT,MF,MT);
  pLVar1 = &((this->sequence_).
             super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
             ._M_impl.super__Vector_impl_data._M_finish)->super_ListRecord;
  for (this_00 = &((this->sequence_).
                   super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord; this_00 != pLVar1;
      this_00 = this_00 + 1) {
    ListRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  this->interpolation_.print( it, MAT, MF, MT );
  for ( const auto& entry : this->sequence_ ) {

    ENDFtk::print( entry, it, MAT, MF, MT );
  }
}